

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O0

int econf_edit(econf_file **key_file,char *delimiters,char *comment)

{
  FILE *pFVar1;
  int iVar2;
  econf_file *peVar3;
  undefined8 uVar4;
  int *piVar5;
  bool bVar6;
  char local_63 [3];
  undefined8 uStack_60;
  char input [3];
  size_t groupEditCount;
  size_t groupCount;
  char **groupsEdit;
  char **groups;
  econf_file *peStack_38;
  int ret;
  econf_file *key_file_edit;
  char *pcStack_28;
  econf_err econf_error;
  char *comment_local;
  char *delimiters_local;
  econf_file **key_file_local;
  
  peStack_38 = (econf_file *)0x0;
  pcStack_28 = comment;
  comment_local = delimiters;
  delimiters_local = (char *)key_file;
  if (*conf_filename == '/') {
    key_file_edit._4_4_ = econf_readFile(key_file,conf_filename,delimiters,comment);
  }
  else {
    peVar3 = init_key_file();
    *(econf_file **)delimiters_local = peVar3;
    key_file_edit._4_4_ =
         econf_readConfig(delimiters_local,0,0,conf_basename,conf_suffix,comment_local,pcStack_28);
  }
  pFVar1 = _stderr;
  if (key_file_edit._4_4_ == 3) {
    key_file_edit._4_4_ = econf_newIniFile(delimiters_local);
    pFVar1 = _stderr;
    if (key_file_edit._4_4_ != 0) {
      uVar4 = econf_errString(key_file_edit._4_4_);
      fprintf(pFVar1,"%s\n",uVar4);
      return -1;
    }
    key_file_edit._4_4_ = 0;
  }
  else if (key_file_edit._4_4_ != 0) {
    uVar4 = econf_errString(key_file_edit._4_4_);
    fprintf(pFVar1,"%s\n",uVar4);
    return -1;
  }
  iVar2 = econf_edit_editor(&stack0xffffffffffffffc8,(econf_file **)delimiters_local,comment_local,
                            pcStack_28);
  if (iVar2 == 0) {
    groups._4_4_ = 0;
    groupsEdit = (char **)0x0;
    groupCount = 0;
    groupEditCount = 0;
    uStack_60 = 0;
    key_file_edit._4_4_ =
         econf_getGroups(*(undefined8 *)delimiters_local,&groupEditCount,&groupsEdit);
    pFVar1 = _stderr;
    if (key_file_edit._4_4_ == 0) {
      key_file_edit._4_4_ = econf_getGroups(peStack_38,&stack0xffffffffffffffa0,&groupCount);
      pFVar1 = _stderr;
      if (key_file_edit._4_4_ == 0) {
        iVar2 = access(conf_dir,0);
        if (((iVar2 == -1) && (piVar5 = __errno_location(), *piVar5 == 2)) &&
           (iVar2 = mkdir(conf_dir,0x1ed), iVar2 != 0)) {
          perror("mkdir() failed");
          groups._4_4_ = -1;
        }
        else {
          iVar2 = access(conf_path,0);
          if ((iVar2 == 0) && ((non_interactive & 1U) == 0)) {
            memset(local_63,0,3);
            do {
              fprintf(_stdout,"The file %s/%s already exists!\n",conf_dir,conf_filename);
              fprintf(_stdout,"Do you really want to overwrite it?\nYes [y], no [n]\n");
              iVar2 = __isoc99_scanf("%2s",local_63);
              if (iVar2 != 1) {
                fprintf(_stderr,"Didn\'t read correctly\n");
                strcpy(local_63,"");
              }
              iVar2 = strcmp(local_63,"y");
              bVar6 = false;
              if (iVar2 != 0) {
                iVar2 = strcmp(local_63,"n");
                bVar6 = iVar2 != 0;
              }
            } while (bVar6);
            iVar2 = strcmp(local_63,"y");
            if (iVar2 == 0) {
              printf("Writing file %s to %s\n",conf_filename,conf_dir);
              key_file_edit._4_4_ = econf_writeFile(peStack_38,conf_dir,conf_filename);
              pFVar1 = _stderr;
              if (key_file_edit._4_4_ != 0) {
                uVar4 = econf_errString(key_file_edit._4_4_);
                fprintf(pFVar1,"%s\n",uVar4);
                groups._4_4_ = -1;
              }
            }
          }
          else {
            printf("Writing file %s to %s\n",conf_filename,conf_dir);
            key_file_edit._4_4_ = econf_writeFile(peStack_38,conf_dir,conf_filename);
            pFVar1 = _stderr;
            if (key_file_edit._4_4_ != 0) {
              uVar4 = econf_errString(key_file_edit._4_4_);
              fprintf(pFVar1,"%s\n",uVar4);
              groups._4_4_ = -1;
            }
          }
        }
      }
      else {
        uVar4 = econf_errString(key_file_edit._4_4_);
        fprintf(pFVar1,"%s\n",uVar4);
        groups._4_4_ = -1;
      }
    }
    else {
      uVar4 = econf_errString(key_file_edit._4_4_);
      fprintf(pFVar1,"%s\n",uVar4);
      groups._4_4_ = -1;
    }
    econf_freeFile(peStack_38);
    econf_freeArray(groupCount);
    econf_freeArray(groupsEdit);
    key_file_local._4_4_ = groups._4_4_;
  }
  else {
    econf_freeFile(peStack_38);
    key_file_local._4_4_ = -1;
  }
  return key_file_local._4_4_;
}

Assistant:

static int econf_edit(struct econf_file **key_file, const char *delimiters, const char *comment)
{
    econf_err econf_error;
    econf_file *key_file_edit = NULL;

    if (conf_filename[0] == '/') {
        /* reading one file only */
        econf_error = econf_readFile(key_file, conf_filename,
				     delimiters, comment);
    } else {
        *key_file = init_key_file();
        econf_error = econf_readConfig(key_file, NULL, NULL, conf_basename,
				     conf_suffix, delimiters, comment);
    }

    if (econf_error == ECONF_NOFILE) {
        /* the file does not exist */
        /* create empty key file */
        if ((econf_error = econf_newIniFile(key_file))) {
            fprintf(stderr, "%s\n", econf_errString(econf_error));
            return -1;
        }
    } else if (econf_error != ECONF_SUCCESS) {
        /* other errors besides "missing config file" or "no error" */
        fprintf(stderr, "%s\n", econf_errString(econf_error));
        return -1;
    }

    if (econf_edit_editor(&key_file_edit, key_file, delimiters, comment)) {
        econf_free(key_file_edit);
        return -1;
    }

    /*********************************************************************/
    /* TODO: analyse the key_files of the 2 tmp files to extract the change
     * - starting with groups, then keys and then values
     */
    int ret = 0;
    char **groups = NULL;
    char **groupsEdit = NULL;
    size_t groupCount = 0;
    size_t groupEditCount = 0;

    /* extract the groups of the original key_file into groups */
    econf_error = econf_getGroups(*key_file, &groupCount, &groups);
    if (econf_error) {
        fprintf(stderr, "%s\n", econf_errString(econf_error));
        ret = -1;
        goto cleanup;
    }
    /* extract the groups of the edited key_file into groupsEdit */
    econf_error = econf_getGroups(key_file_edit, &groupEditCount, &groupsEdit);
    if (econf_error) {
        fprintf(stderr, "%s\n", econf_errString(econf_error));
        ret = -1;
        goto cleanup;
    }

    /* if path does not exist, create it */
    if (access(conf_dir, F_OK) == -1 && errno == ENOENT) {
        if (mkdir(conf_dir, 0755) != 0) {
            perror("mkdir() failed");
            ret = -1;
            goto cleanup;
	}
    }
    /* check if file already exists */
    if (access(conf_path, F_OK) == 0 && !non_interactive) {
        char input[3] = "";
        /* let the user verify that the file should really be overwritten */
        do {
            fprintf(stdout, "The file %s/%s already exists!\n", conf_dir, conf_filename);
            fprintf(stdout, "Do you really want to overwrite it?\nYes [y], no [n]\n");
            if (scanf("%2s", input) != 1) {
                fprintf(stderr, "Didn't read correctly\n");
		strcpy(input, "");
            }
        } while (strcmp(input, "y") != 0 && strcmp(input, "n") != 0);

        if (strcmp(input, "y") == 0) {
            printf( "Writing file %s to %s\n",conf_filename, conf_dir);
            if ((econf_error = econf_writeFile(key_file_edit, conf_dir, conf_filename))) {
                fprintf(stderr, "%s\n", econf_errString(econf_error));
                ret = -1;
                goto cleanup;
            }
        }
    } else {
        printf( "Writing file %s to %s\n",conf_filename, conf_dir);
        if ((econf_error = econf_writeFile(key_file_edit, conf_dir, conf_filename))) {
            fprintf(stderr, "%s\n", econf_errString(econf_error));
            ret = -1;
            goto cleanup;
        }
    }

    /* cleanup */
  cleanup:
    econf_free(key_file_edit);
    econf_free(groupsEdit);
    econf_free(groups);
    return ret;

}